

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiWindow **__dest;
  bool bVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow **ppIVar4;
  int iVar5;
  ulong uVar6;
  
  pIVar3 = GImGui;
  iVar5 = (GImGui->WindowsFocusOrder).Size;
  if (iVar5 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    iVar5 = (pIVar3->WindowsFocusOrder).Size;
  }
  ppIVar4 = (pIVar3->WindowsFocusOrder).Data;
  if (1 < iVar5 && ppIVar4[(long)iVar5 + -1] != window) {
    uVar6 = (ulong)(iVar5 - 1);
    uVar2 = iVar5 - 2;
    do {
      if ((pIVar3->WindowsFocusOrder).Size <= (int)uVar2) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        ppIVar4 = (pIVar3->WindowsFocusOrder).Data;
      }
      if (ppIVar4[uVar2] == window) {
        iVar5 = (pIVar3->WindowsFocusOrder).Size;
        if (iVar5 <= (int)uVar2) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          ppIVar4 = (pIVar3->WindowsFocusOrder).Data;
          iVar5 = (pIVar3->WindowsFocusOrder).Size;
        }
        __dest = ppIVar4 + uVar2;
        if (iVar5 <= (int)(uVar2 + 1)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          ppIVar4 = (pIVar3->WindowsFocusOrder).Data;
          iVar5 = (pIVar3->WindowsFocusOrder).Size;
        }
        memmove(__dest,ppIVar4 + uVar6,(long)(iVar5 - (int)uVar6) << 3);
        (pIVar3->WindowsFocusOrder).Data[(long)(pIVar3->WindowsFocusOrder).Size + -1] = window;
        return;
      }
      uVar6 = uVar6 - 1;
      bVar1 = 0 < (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}